

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiColorMod *pIVar7;
  float fVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ImDrawList *pIVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ImVec2 local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar12 = window->WasActive;
    pIVar6 = GImGui->NavWindow;
    if (bVar12 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar18 = " *Inactive*";
    }
    else {
      pcVar18 = "";
    }
    bVar10 = TreeNodeEx(label,(uint)(pIVar6 == window),"%s \'%s\'%s",label,window->Name,pcVar18);
    pIVar9 = GImGui;
    if (bVar12 == false) {
      pIVar7 = (GImGui->ColorStack).Data;
      lVar15 = (long)(GImGui->ColorStack).Size;
      pIVar1 = &pIVar7[lVar15 + -1].BackupValue;
      fVar26 = pIVar1->y;
      fVar27 = pIVar1->z;
      fVar8 = pIVar1->w;
      pIVar2 = (GImGui->Style).Colors + pIVar7[lVar15 + -1].Col;
      pIVar2->x = pIVar1->x;
      pIVar2->y = fVar26;
      pIVar2->z = fVar27;
      pIVar2->w = fVar8;
      (pIVar9->ColorStack).Size = (pIVar9->ColorStack).Size + -1;
    }
    bVar11 = IsItemHovered(0);
    if ((bVar11 & bVar12) == 1) {
      pIVar13 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      local_68.x = (window->Size).x + (window->Pos).x;
      local_68.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(pIVar13,&window->Pos,&local_68,0xff00ffff,0.0,0,1.0);
    }
    if (bVar10) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar5 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,SUB84((double)(window->Size).x,0),
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar18 = "Child ";
      if ((uVar5 >> 0x18 & 1) == 0) {
        pcVar18 = "";
      }
      auVar29._0_4_ = -(uint)((uVar5 & 0x10000000) == 0);
      auVar29._4_4_ = -(uint)((uVar5 & 0x8000000) == 0);
      auVar29._8_4_ = -(uint)((uVar5 & 0x4000000) == 0);
      auVar29._12_4_ = -(uint)((uVar5 & 0x2000000) == 0);
      auVar28._0_4_ = -(uint)((uVar5 & 0x40) == 0);
      auVar28._4_4_ = -(uint)((uVar5 & 0x40000) == 0);
      auVar28._8_4_ = -(uint)((uVar5 & 0x200) == 0);
      auVar28._12_4_ = -(uint)((uVar5 & 0x100) == 0);
      auVar29 = packssdw(auVar28,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      pcVar14 = "Tooltip ";
      if ((auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar16 = "Popup ";
      if ((auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "";
      }
      pcVar19 = "Modal ";
      if ((auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar19 = "";
      }
      pcVar20 = "ChildMenu ";
      if ((auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar20 = "";
      }
      pcVar21 = "NoSavedSettings ";
      if ((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar21 = "";
      }
      pcVar24 = "NoMouseInputs";
      if ((auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar24 = "";
      }
      pcVar22 = "NoNavInputs";
      if ((auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar22 = "";
      }
      pcVar23 = "AlwaysAutoResize";
      if ((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar23 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar5,pcVar18,pcVar14,pcVar16,pcVar19
                 ,pcVar20,pcVar21,pcVar24,pcVar22,pcVar23);
      pcVar18 = "X";
      if (window->ScrollbarX == false) {
        pcVar18 = "";
      }
      pcVar14 = "Y";
      if (window->ScrollbarY == false) {
        pcVar14 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,SUB84((double)(window->Scroll).y,0),
                 (double)(window->ScrollMax).y,pcVar18,pcVar14);
      if ((window->Active != false) || (uVar17 = 0xffffffff, window->WasActive != false)) {
        uVar17 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar17)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar15 = 0x378;
      uVar17 = 0;
      do {
        uVar3 = *(undefined8 *)((long)window + lVar15 * 4 + -0xa60);
        uVar4 = *(undefined8 *)((long)window + lVar15 * 4 + -0xa58);
        fVar27 = (float)((ulong)uVar4 >> 0x20);
        fVar26 = (float)((ulong)uVar3 >> 0x20);
        if (((float)uVar3 < fVar27) || (fVar26 < fVar27)) {
          uStack_50 = 0;
          uStack_40 = 0;
          local_58 = uVar3;
          local_48 = uVar4;
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)(float)uVar3,
                     (double)fVar26,SUB84((double)(float)uVar4,0),(double)fVar27,uVar17,
                     (ulong)*(uint *)((long)&window->Name + lVar15));
          bVar12 = IsItemHovered(0);
          if (bVar12) {
            pIVar13 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
            fVar26 = (window->Pos).x;
            local_68.x = (float)local_58 + fVar26;
            fVar27 = (window->Pos).y;
            local_68.y = local_58._4_4_ + fVar27;
            local_60.x = (float)local_48 + fVar26;
            local_60.y = local_48._4_4_ + fVar27;
            ImDrawList::AddRect(pIVar13,&local_68,&local_60,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",uVar17,(ulong)*(uint *)((long)&window->Name + lVar15))
          ;
        }
        lVar15 = lVar15 + 4;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (lVar15 == 0x37c);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar18 = "NULL";
      }
      else {
        pcVar18 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar18);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar12 = TreeNode("Columns","Columns sets (%d)");
        if (bVar12) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar15 = 0;
            lVar25 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar15));
              lVar25 = lVar25 + 1;
              lVar15 = lVar15 + 0x88;
            } while (lVar25 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}